

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.cpp
# Opt level: O1

cali_attr_type __thiscall cali::Attribute::type(Attribute *this)

{
  cali_attr_type cVar1;
  Node *pNVar2;
  
  pNVar2 = this->m_node;
  while( true ) {
    if (pNVar2 == (Node *)0x0) {
      return CALI_TYPE_INV;
    }
    if (pNVar2->m_attribute == 9) break;
    pNVar2 = *(Node **)((long)&(((pNVar2->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                               super_LockfreeIntrusiveTree<cali::Node>).m_me +
                       (pNVar2->super_LockfreeIntrusiveTree<cali::Node>).m_node);
  }
  cVar1 = cali_variant_to_type((pNVar2->m_data).m_v,(_Bool *)0x0);
  return cVar1;
}

Assistant:

cali_attr_type Attribute::type() const
{
    for (const Node* node = m_node; node; node = node->parent())
        if (node->attribute() == TYPE_ATTR_ID)
            return node->data().to_attr_type();

    return CALI_TYPE_INV;
}